

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectjson.cpp
# Opt level: O3

bool readFromFile(QFile *device,QJsonArray *allMetaObjects)

{
  FILE *__stream;
  char *pcVar1;
  long in_FS_OFFSET;
  bool bVar2;
  QJsonDocument metaObjects;
  QArrayData *local_c0;
  longlong local_b8;
  QArrayData *local_a8;
  undefined8 *local_a0;
  QArrayData *local_90;
  longlong local_88;
  QByteArray local_78;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QArrayData *local_50;
  undefined8 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QIODevice::readAll();
  if (local_58 == (undefined1 *)0x0) {
    readFromFile();
    bVar2 = false;
  }
  else {
    local_78.d.ptr = (char *)0xffffffff;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QJsonDocument::fromJson(&local_78,(QJsonParseError *)&local_78.d.size);
    __stream = _stderr;
    bVar2 = local_78.d.ptr._4_4_ == 0;
    if (bVar2) {
      QJsonDocument::object();
      QJsonValue::QJsonValue((QJsonValue *)&local_50,(QJsonObject *)&local_90);
      QJsonArray::append((QJsonValue *)allMetaObjects);
      QJsonValue::~QJsonValue((QJsonValue *)&local_50);
      QJsonObject::~QJsonObject((QJsonObject *)&local_90);
    }
    else {
      (**(code **)(*(long *)device + 0xe8))(&local_90,device);
      QString::toLocal8Bit_helper((QChar *)&local_50,local_88);
      pcVar1 = local_78.d.ptr;
      if (local_48 == (undefined8 *)0x0) {
        local_48 = &QByteArray::_empty;
      }
      QJsonParseError::errorString();
      QString::toLocal8Bit_helper((QChar *)&local_a8,local_b8);
      if (local_a0 == (undefined8 *)0x0) {
        local_a0 = &QByteArray::_empty;
      }
      fprintf(__stream,"%s:%d: %s\n",local_48,(ulong)pcVar1 & 0xffffffff,local_a0);
      if (local_a8 != (QArrayData *)0x0) {
        LOCK();
        (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a8,1,0x10);
        }
      }
      if (local_c0 != (QArrayData *)0x0) {
        LOCK();
        (local_c0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c0,2,0x10);
        }
      }
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,1,0x10);
        }
      }
      if (local_90 != (QArrayData *)0x0) {
        LOCK();
        (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_90,2,0x10);
        }
      }
    }
    QJsonDocument::~QJsonDocument((QJsonDocument *)&local_78);
  }
  if ((QArrayData *)local_78.d.size != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78.d.size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78.d.size)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78.d.size)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78.d.size,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool readFromFile(QFile *device, QJsonArray *allMetaObjects)
{
    const QByteArray contents = device->readAll();
    if (contents.isEmpty()) {
        fprintf(stderr, "%s:0: metatypes input file is empty\n", qPrintable(device->fileName()));
        return false;
    }

    QJsonParseError error {};
    QJsonDocument metaObjects = QJsonDocument::fromJson(contents, &error);
    if (error.error != QJsonParseError::NoError) {
        fprintf(stderr, "%s:%d: %s\n", qPrintable(device->fileName()), error.offset,
                qPrintable(error.errorString()));
        return false;
    }

    allMetaObjects->append(metaObjects.object());
    return true;
}